

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z1_64xN_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,int upsample_above,int dx)

{
  undefined1 (*pauVar1) [32];
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  short sVar12;
  short sVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  uint uVar18;
  int iVar19;
  undefined8 *puVar20;
  long in_RCX;
  long in_RDX;
  undefined2 in_SI;
  undefined6 in_register_00000032;
  int in_EDI;
  uint in_R9D;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int mdif;
  int j;
  __m256i shift;
  int i;
  int base;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m256i mask256;
  __m256i base_inc256;
  __m256i max_base_x256;
  __m256i diff;
  __m256i a_mbase_x;
  __m256i c3f;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int local_864;
  int local_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  int local_7c8;
  uint local_7c4;
  ushort local_670;
  undefined8 *local_650;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  
  local_650 = (undefined8 *)CONCAT62(in_register_00000032,in_SI);
  uVar18 = in_EDI + 0x3f;
  auVar3 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar3 = vpinsrw_avx(auVar3,0x10,2);
  auVar3 = vpinsrw_avx(auVar3,0x10,3);
  auVar3 = vpinsrw_avx(auVar3,0x10,4);
  auVar3 = vpinsrw_avx(auVar3,0x10,5);
  auVar3 = vpinsrw_avx(auVar3,0x10,6);
  auVar3 = vpinsrw_avx(auVar3,0x10,7);
  auVar4 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar4 = vpinsrw_avx(auVar4,0x10,2);
  auVar4 = vpinsrw_avx(auVar4,0x10,3);
  auVar4 = vpinsrw_avx(auVar4,0x10,4);
  auVar4 = vpinsrw_avx(auVar4,0x10,5);
  auVar4 = vpinsrw_avx(auVar4,0x10,6);
  auVar4 = vpinsrw_avx(auVar4,0x10,7);
  uStack_410 = auVar4._0_8_;
  uStack_408 = auVar4._8_8_;
  uVar2 = *(ushort *)(in_RCX + (long)(int)uVar18 * 2);
  auVar4 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,2);
  auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,3);
  auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,4);
  auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,5);
  auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,6);
  auVar4 = vpinsrw_avx(auVar4,(uint)uVar2,7);
  auVar5 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,2);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,3);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,4);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,5);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,6);
  auVar5 = vpinsrw_avx(auVar5,(uint)uVar2,7);
  local_3e0 = auVar4._0_8_;
  uStack_3d8 = auVar4._8_8_;
  uStack_3d0 = auVar5._0_8_;
  uStack_3c8 = auVar5._8_8_;
  local_670 = (ushort)uVar18;
  auVar5 = vpinsrw_avx(ZEXT216(local_670),uVar18 & 0xffff,1);
  auVar5 = vpinsrw_avx(auVar5,uVar18 & 0xffff,2);
  auVar5 = vpinsrw_avx(auVar5,uVar18 & 0xffff,3);
  auVar5 = vpinsrw_avx(auVar5,uVar18 & 0xffff,4);
  auVar5 = vpinsrw_avx(auVar5,uVar18 & 0xffff,5);
  auVar5 = vpinsrw_avx(auVar5,uVar18 & 0xffff,6);
  auVar5 = vpinsrw_avx(auVar5,uVar18 & 0xffff,7);
  auVar6 = vpinsrw_avx(ZEXT216(local_670),uVar18 & 0xffff,1);
  auVar6 = vpinsrw_avx(auVar6,uVar18 & 0xffff,2);
  auVar6 = vpinsrw_avx(auVar6,uVar18 & 0xffff,3);
  auVar6 = vpinsrw_avx(auVar6,uVar18 & 0xffff,4);
  auVar6 = vpinsrw_avx(auVar6,uVar18 & 0xffff,5);
  auVar6 = vpinsrw_avx(auVar6,uVar18 & 0xffff,6);
  auVar6 = vpinsrw_avx(auVar6,uVar18 & 0xffff,7);
  uStack_390 = auVar6._0_8_;
  uStack_388 = auVar6._8_8_;
  auVar6 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar6 = vpinsrw_avx(auVar6,0x3f,2);
  auVar6 = vpinsrw_avx(auVar6,0x3f,3);
  auVar6 = vpinsrw_avx(auVar6,0x3f,4);
  auVar6 = vpinsrw_avx(auVar6,0x3f,5);
  auVar6 = vpinsrw_avx(auVar6,0x3f,6);
  auVar6 = vpinsrw_avx(auVar6,0x3f,7);
  auVar7 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar7 = vpinsrw_avx(auVar7,0x3f,2);
  auVar7 = vpinsrw_avx(auVar7,0x3f,3);
  auVar7 = vpinsrw_avx(auVar7,0x3f,4);
  auVar7 = vpinsrw_avx(auVar7,0x3f,5);
  auVar7 = vpinsrw_avx(auVar7,0x3f,6);
  auVar7 = vpinsrw_avx(auVar7,0x3f,7);
  auVar21 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
  uStack_350 = auVar21._0_8_;
  uStack_348 = auVar21._8_8_;
  local_7c8 = 0;
  local_7c4 = in_R9D;
  while( true ) {
    if (in_EDI <= local_7c8) {
      return;
    }
    iVar19 = (int)local_7c4 >> 6;
    if ((int)uVar18 <= iVar19) break;
    auVar21 = vpinsrw_avx(ZEXT216((ushort)local_7c4),local_7c4 & 0xffff,1);
    auVar21 = vpinsrw_avx(auVar21,local_7c4 & 0xffff,2);
    auVar21 = vpinsrw_avx(auVar21,local_7c4 & 0xffff,3);
    auVar21 = vpinsrw_avx(auVar21,local_7c4 & 0xffff,4);
    auVar21 = vpinsrw_avx(auVar21,local_7c4 & 0xffff,5);
    auVar21 = vpinsrw_avx(auVar21,local_7c4 & 0xffff,6);
    auVar21 = vpinsrw_avx(auVar21,local_7c4 & 0xffff,7);
    auVar8 = vpinsrw_avx(ZEXT216((ushort)local_7c4),local_7c4 & 0xffff,1);
    auVar8 = vpinsrw_avx(auVar8,local_7c4 & 0xffff,2);
    auVar8 = vpinsrw_avx(auVar8,local_7c4 & 0xffff,3);
    auVar8 = vpinsrw_avx(auVar8,local_7c4 & 0xffff,4);
    auVar8 = vpinsrw_avx(auVar8,local_7c4 & 0xffff,5);
    auVar8 = vpinsrw_avx(auVar8,local_7c4 & 0xffff,6);
    auVar8 = vpinsrw_avx(auVar8,local_7c4 & 0xffff,7);
    auVar22 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar21;
    uStack_310 = auVar22._0_8_;
    uStack_308 = auVar22._8_8_;
    auVar10._16_8_ = uStack_310;
    auVar10._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar8;
    auVar10._24_8_ = uStack_308;
    auVar9._16_8_ = uStack_350;
    auVar9._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar7;
    auVar9._24_8_ = uStack_348;
    auVar9 = vpand_avx2(auVar10,auVar9);
    auVar9 = vpsrlw_avx2(auVar9,ZEXT416(1));
    for (local_864 = 0; local_864 < 0x40; local_864 = local_864 + 0x10) {
      if ((int)(uVar18 - (iVar19 + local_864)) < 1) {
        puVar20 = (undefined8 *)((long)local_650 + (long)local_864 * 2);
        *puVar20 = local_3e0;
        puVar20[1] = uStack_3d8;
        puVar20[2] = uStack_3d0;
        puVar20[3] = uStack_3c8;
      }
      else {
        pauVar1 = (undefined1 (*) [32])(in_RCX + (long)iVar19 * 2 + (long)local_864 * 2);
        auVar11 = vpsubw_avx2(*(undefined1 (*) [32])
                               (in_RCX + (long)iVar19 * 2 + 2 + (long)local_864 * 2),*pauVar1);
        auVar10 = vpsllw_avx2(*pauVar1,ZEXT416(5));
        auVar14._16_8_ = uStack_410;
        auVar14._0_16_ = auVar3;
        auVar14._24_8_ = uStack_408;
        auVar10 = vpaddw_avx2(auVar10,auVar14);
        auVar11 = vpmullw_avx2(auVar11,auVar9);
        auVar10 = vpaddw_avx2(auVar10,auVar11);
        auVar11 = vpsrlw_avx2(auVar10,ZEXT416(5));
        sVar12 = (short)iVar19;
        sVar13 = (short)local_864;
        auVar21 = vpinsrw_avx(ZEXT216((ushort)(sVar12 + sVar13)),(uint)(ushort)(sVar12 + 1 + sVar13)
                              ,1);
        auVar21 = vpinsrw_avx(auVar21,(uint)(ushort)(sVar12 + 2 + sVar13),2);
        auVar21 = vpinsrw_avx(auVar21,(uint)(ushort)(sVar12 + 3 + sVar13),3);
        auVar21 = vpinsrw_avx(auVar21,(uint)(ushort)(sVar12 + 4 + sVar13),4);
        auVar21 = vpinsrw_avx(auVar21,(uint)(ushort)(sVar12 + 5 + sVar13),5);
        auVar21 = vpinsrw_avx(auVar21,(uint)(ushort)(sVar12 + 6 + sVar13),6);
        auVar21 = vpinsrw_avx(auVar21,(uint)(ushort)(sVar12 + 7 + sVar13),7);
        auVar8 = vpinsrw_avx(ZEXT216((ushort)(sVar12 + 8 + sVar13)),
                             (uint)(ushort)(sVar12 + 9 + sVar13),1);
        auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar12 + 10 + sVar13),2);
        auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar12 + 0xb + sVar13),3);
        auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar12 + 0xc + sVar13),4);
        auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar12 + 0xd + sVar13),5);
        auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar12 + 0xe + sVar13),6);
        auVar8 = vpinsrw_avx(auVar8,(uint)(ushort)(sVar12 + 0xf + sVar13),7);
        uStack_f0 = auVar8._0_8_;
        uStack_e8 = auVar8._8_8_;
        auVar16._16_8_ = uStack_390;
        auVar16._0_16_ = auVar5;
        auVar16._24_8_ = uStack_388;
        auVar15._16_8_ = uStack_f0;
        auVar15._0_16_ = auVar21;
        auVar15._24_8_ = uStack_e8;
        auVar10 = vpcmpgtw_avx2(auVar16,auVar15);
        auVar17._16_8_ = uStack_3d0;
        auVar17._0_16_ = auVar4;
        auVar17._24_8_ = uStack_3c8;
        auVar10 = vpblendvb_avx2(auVar17,auVar11,auVar10);
        puVar20 = (undefined8 *)((long)local_650 + (long)local_864 * 2);
        local_820 = auVar10._0_8_;
        uStack_818 = auVar10._8_8_;
        uStack_810 = auVar10._16_8_;
        uStack_808 = auVar10._24_8_;
        *puVar20 = local_820;
        puVar20[1] = uStack_818;
        puVar20[2] = uStack_810;
        puVar20[3] = uStack_808;
      }
    }
    local_7c4 = in_R9D + local_7c4;
    local_7c8 = local_7c8 + 1;
    local_650 = (undefined8 *)(in_RDX * 2 + (long)local_650);
  }
  for (local_828 = local_7c8; local_828 < in_EDI; local_828 = local_828 + 1) {
    *local_650 = local_3e0;
    local_650[1] = uStack_3d8;
    local_650[2] = uStack_3d0;
    local_650[3] = uStack_3c8;
    local_650[4] = local_3e0;
    local_650[5] = uStack_3d8;
    local_650[6] = uStack_3d0;
    local_650[7] = uStack_3c8;
    local_650[8] = local_3e0;
    local_650[9] = uStack_3d8;
    local_650[10] = uStack_3d0;
    local_650[0xb] = uStack_3c8;
    local_650[0xc] = local_3e0;
    local_650[0xd] = uStack_3d8;
    local_650[0xe] = uStack_3d0;
    local_650[0xf] = uStack_3c8;
    local_650 = (undefined8 *)(in_RDX * 2 + (long)local_650);
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z1_64xN_avx2(int N, uint16_t *dst,
                                              ptrdiff_t stride,
                                              const uint16_t *above,
                                              int upsample_above, int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((64 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0, a1, a32, a16, c3f;
  __m256i a_mbase_x, diff, max_base_x256, base_inc256, mask256;

  a16 = _mm256_set1_epi16(16);
  a_mbase_x = _mm256_set1_epi16(above[max_base_x]);
  max_base_x256 = _mm256_set1_epi16(max_base_x);
  c3f = _mm256_set1_epi16(0x3f);

  int x = dx;
  for (int r = 0; r < N; r++, dst += stride) {
    __m256i b, res;

    int base = x >> frac_bits;
    if (base >= max_base_x) {
      for (int i = r; i < N; ++i) {
        _mm256_storeu_si256((__m256i *)dst, a_mbase_x);  // save 32 values
        _mm256_storeu_si256((__m256i *)(dst + 16), a_mbase_x);
        _mm256_storeu_si256((__m256i *)(dst + 32), a_mbase_x);
        _mm256_storeu_si256((__m256i *)(dst + 48), a_mbase_x);
        dst += stride;
      }
      return;
    }

    __m256i shift =
        _mm256_srli_epi16(_mm256_and_si256(_mm256_set1_epi16(x), c3f), 1);

    for (int j = 0; j < 64; j += 16) {
      int mdif = max_base_x - (base + j);
      if (mdif <= 0) {
        _mm256_storeu_si256((__m256i *)(dst + j), a_mbase_x);
      } else {
        a0 = _mm256_loadu_si256((__m256i *)(above + base + j));
        a1 = _mm256_loadu_si256((__m256i *)(above + base + 1 + j));

        diff = _mm256_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm256_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm256_add_epi16(a32, a16);  // a[x] * 32 + 16
        b = _mm256_mullo_epi16(diff, shift);

        res = _mm256_add_epi16(a32, b);
        res = _mm256_srli_epi16(res, 5);

        base_inc256 = _mm256_setr_epi16(
            base + j, base + j + 1, base + j + 2, base + j + 3, base + j + 4,
            base + j + 5, base + j + 6, base + j + 7, base + j + 8,
            base + j + 9, base + j + 10, base + j + 11, base + j + 12,
            base + j + 13, base + j + 14, base + j + 15);

        mask256 = _mm256_cmpgt_epi16(max_base_x256, base_inc256);
        res = _mm256_blendv_epi8(a_mbase_x, res, mask256);
        _mm256_storeu_si256((__m256i *)(dst + j), res);  // 16 16bit values
      }
    }
    x += dx;
  }
}